

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c0_compile_semantic_analysis.cpp
# Opt level: O0

void ArgumentCheck(string *identifier_name,int line_number,int character_number,
                  vector<_SymbolType,_std::allocator<_SymbolType>_> *value_argument_type)

{
  value_type vVar1;
  char *pcVar2;
  LogTools *pLVar3;
  bool bVar4;
  size_type sVar5;
  reference pvVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  allocator local_141;
  undefined1 local_140 [8];
  string str2;
  undefined1 local_118 [8];
  string str1;
  int i;
  string local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  int local_4c;
  int local_48;
  int value_argument_type_len;
  int argument_type_len;
  undefined1 local_38 [8];
  vector<_SymbolType,_std::allocator<_SymbolType>_> argument_type;
  vector<_SymbolType,_std::allocator<_SymbolType>_> *value_argument_type_local;
  int character_number_local;
  int line_number_local;
  string *identifier_name_local;
  
  argument_type.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)value_argument_type;
  bVar4 = FunctionTable::Find(handle_func_table,identifier_name);
  if (bVar4) {
    std::vector<_SymbolType,_std::allocator<_SymbolType>_>::vector
              ((vector<_SymbolType,_std::allocator<_SymbolType>_> *)local_38);
    FunctionTable::GetTermArgumentType
              (handle_func_table,identifier_name,
               (vector<_SymbolType,_std::allocator<_SymbolType>_> *)local_38);
    sVar5 = std::vector<_SymbolType,_std::allocator<_SymbolType>_>::size
                      ((vector<_SymbolType,_std::allocator<_SymbolType>_> *)local_38);
    local_48 = (int)sVar5;
    sVar5 = std::vector<_SymbolType,_std::allocator<_SymbolType>_>::size
                      ((vector<_SymbolType,_std::allocator<_SymbolType>_> *)
                       argument_type.super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage);
    pLVar3 = g_log_tools;
    local_4c = (int)sVar5;
    if (local_48 == local_4c) {
      for (str1.field_2._8_4_ = 0; (int)str1.field_2._8_4_ < local_4c;
          str1.field_2._8_4_ = str1.field_2._8_4_ + 1) {
        pvVar6 = std::vector<_SymbolType,_std::allocator<_SymbolType>_>::operator[]
                           ((vector<_SymbolType,_std::allocator<_SymbolType>_> *)local_38,
                            (long)(int)str1.field_2._8_4_);
        vVar1 = *pvVar6;
        pvVar6 = std::vector<_SymbolType,_std::allocator<_SymbolType>_>::operator[]
                           ((vector<_SymbolType,_std::allocator<_SymbolType>_> *)
                            argument_type.
                            super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,(long)(int)str1.field_2._8_4_)
        ;
        if (vVar1 != *pvVar6) {
          pvVar6 = std::vector<_SymbolType,_std::allocator<_SymbolType>_>::operator[]
                             ((vector<_SymbolType,_std::allocator<_SymbolType>_> *)local_38,
                              (long)(int)str1.field_2._8_4_);
          pcVar2 = symbol_type_string[*pvVar6];
          std::allocator<char>::allocator();
          std::__cxx11::string::string
                    ((string *)local_118,pcVar2,(allocator *)(str2.field_2._M_local_buf + 0xf));
          std::allocator<char>::~allocator((allocator<char> *)(str2.field_2._M_local_buf + 0xf));
          pvVar6 = std::vector<_SymbolType,_std::allocator<_SymbolType>_>::operator[]
                             ((vector<_SymbolType,_std::allocator<_SymbolType>_> *)
                              argument_type.
                              super__Vector_base<_SymbolType,_std::allocator<_SymbolType>_>._M_impl.
                              super__Vector_impl_data._M_end_of_storage,
                              (long)(int)str1.field_2._8_4_);
          pcVar2 = symbol_type_string[*pvVar6];
          std::allocator<char>::allocator();
          std::__cxx11::string::string((string *)local_140,pcVar2,&local_141);
          std::allocator<char>::~allocator((allocator<char> *)&local_141);
          pLVar3 = g_log_tools;
          std::operator+(&local_1a8,"argument expected: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_118);
          std::operator+(&local_188,&local_1a8,", but value argument had: ");
          std::operator+(&local_168,&local_188,
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_140);
          LogTools::SemanticErrorLogs
                    (pLVar3,&local_168,identifier_name,line_number,character_number);
          std::__cxx11::string::~string((string *)&local_168);
          std::__cxx11::string::~string((string *)&local_188);
          std::__cxx11::string::~string((string *)&local_1a8);
          std::__cxx11::string::~string((string *)local_140);
          std::__cxx11::string::~string((string *)local_118);
        }
      }
      str1.field_2._12_4_ = 0;
    }
    else {
      std::__cxx11::to_string(&local_d0,local_48);
      std::operator+(&local_b0,"argument list expected: ",&local_d0);
      std::operator+(&local_90,&local_b0,", but value argument list had: ");
      std::__cxx11::to_string((string *)&i,local_4c);
      std::operator+(&local_70,&local_90,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&i);
      LogTools::SemanticErrorLogs(pLVar3,&local_70,identifier_name,line_number,character_number);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&i);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      str1.field_2._12_4_ = 1;
    }
    std::vector<_SymbolType,_std::allocator<_SymbolType>_>::~vector
              ((vector<_SymbolType,_std::allocator<_SymbolType>_> *)local_38);
  }
  return;
}

Assistant:

void ArgumentCheck(const string& identifier_name, int line_number, int character_number, vector<SymbolType>& value_argument_type) {
    if (!handle_func_table->Find(identifier_name)) {
        return;
    }
    vector<SymbolType> argument_type;
    handle_func_table->GetTermArgumentType(identifier_name, argument_type);
    int argument_type_len = argument_type.size();
    int value_argument_type_len = value_argument_type.size();
    if (argument_type_len != value_argument_type_len) {
        g_log_tools->SemanticErrorLogs("argument list expected: " + std::to_string(argument_type_len) + ", but value argument list had: "
                + std::to_string(value_argument_type_len), identifier_name, line_number, character_number);
        return;
    }
    for (int i=0; i<value_argument_type_len; ++i) {
        if (argument_type[i] != value_argument_type[i]) {
            string str1 = symbol_type_string[argument_type[i]];
            string str2 = symbol_type_string[value_argument_type[i]];
            g_log_tools->SemanticErrorLogs("argument expected: " + str1 + ", but value argument had: " + str2, identifier_name, line_number, character_number);
        }
    }
}